

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imu-elastic-local-frame-dynamical-system.cpp
# Opt level: O2

void __thiscall
stateObservation::flexibilityEstimation::IMUElasticLocalFrameDynamicalSystem::iterateDynamicsEuler
          (IMUElasticLocalFrameDynamicalSystem *this,Vector3 *positionCom,Vector3 *velocityCom,
          Vector3 *accelerationCom,Vector3 *AngMomentum,Vector3 *dotAngMomentum,Matrix3 *inertia,
          Matrix3 *dotInertia,IndexedVectorArray *contactPos,IndexedVectorArray *contactOri,
          Vector3 *position,Vector3 *linVelocity,Vector *fc,Vector3 *oriVector,Vector3 *angularVel,
          Vector *tc,Vector3 *fm,Vector3 *tm,Vector3 *addiForces,Vector3 *addiMoments,double dt)

{
  Matrix3 *mat;
  Vector3 *acceleration;
  Vector3 *rotationVelocityVectorRate;
  AngleAxis *this_00;
  Matrix3 *src;
  Vector3 *local_60;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_58;
  
  src = computeRotation_(this,oriVector,0);
  mat = &(this->op_).rFlex;
  Eigen::internal::call_assignment<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,3,0,3,3>>
            (mat,src);
  acceleration = &(this->op_).linearAcceleration;
  rotationVelocityVectorRate = &(this->op_).angularAcceleration;
  (*(this->super_DynamicalSystemFunctorBase)._vptr_DynamicalSystemFunctorBase[10])
            (this,positionCom,velocityCom,accelerationCom,AngMomentum,dotAngMomentum,inertia._0_4_,
             dotInertia._0_4_,contactPos,contactOri,position,linVelocity,acceleration,oriVector,mat,
             angularVel,rotationVelocityVectorRate,fc,tc,fm,tm,addiForces,addiMoments);
  kine::integrateKinematics
            (position,linVelocity,acceleration,mat,angularVel,rotationVelocityVectorRate,dt);
  this_00 = &(this->op_).orientationAA;
  Eigen::AngleAxis<double>::operator=
            (this_00,(MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)mat);
  Eigen::operator*(&local_58,&(this->op_).orientationAA.m_angle,(StorageBaseType *)this_00);
  local_60 = oriVector;
  Eigen::NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase>::operator=
            ((NoAlias<Eigen::Matrix<double,3,1,0,3,1>,Eigen::MatrixBase> *)&local_60,
             (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_58);
  computeForcesAndMoments
            (this,contactPos,contactOri,&(this->op_).contactVelArray,&(this->op_).contactAngVelArray
             ,position,linVelocity,oriVector,mat,angularVel,fc,tc);
  return;
}

Assistant:

void IMUElasticLocalFrameDynamicalSystem::iterateDynamicsEuler(const Vector3 & positionCom,
                                                               const Vector3 & velocityCom,
                                                               const Vector3 & accelerationCom,
                                                               const Vector3 & AngMomentum,
                                                               const Vector3 & dotAngMomentum,
                                                               const Matrix3 & inertia,
                                                               const Matrix3 & dotInertia,
                                                               const IndexedVectorArray & contactPos,
                                                               const IndexedVectorArray & contactOri,
                                                               Vector3 & position,
                                                               Vector3 & linVelocity,
                                                               Vector & fc,
                                                               Vector3 & oriVector,
                                                               Vector3 & angularVel,
                                                               Vector & tc,
                                                               const Vector3 & fm,
                                                               const Vector3 & tm,
                                                               const Vector3 & addiForces,
                                                               const Vector3 & addiMoments,
                                                               double dt)
{

  op_.rFlex = computeRotation_(oriVector, 0);
  // compute new acceleration with the current flex position and velocity and input

  //        computeForcesAndMoments (contactPos, contactOri, op_.contactVelArray, op_.contactAngVelArray,
  //                          position, linVelocity, oriVector, op_.rFlex,
  //                             angularVel, fc, tc);

  computeAccelerations(positionCom, velocityCom, accelerationCom, AngMomentum, dotAngMomentum, inertia, dotInertia,
                       contactPos, contactOri, position, linVelocity, op_.linearAcceleration, oriVector, op_.rFlex,
                       angularVel, op_.angularAcceleration, fc, tc, fm, tm, addiForces, addiMoments);

  /// integrate kinematics with the last acceleration
  kine::integrateKinematics(position, linVelocity, op_.linearAcceleration, op_.rFlex, angularVel,
                            op_.angularAcceleration, dt);

  /// Adding a kinematic coupling to improve estimation of the velocities
  //        Vector3 constrainedLinVel;
  //        constrainedLinVel.setZero();
  //
  //        for(int i=0; i<getContactsNumber();++i)
  //        {
  //          constrainedLinVel += Vector3(op_.rFlex*contactPos[i]).cross(angularVel);
  //        }
  //        constrainedLinVel=constrainedLinVel/getContactsNumber();
  //
  //        double alphaLin=0.1; ///kinematic coupling weight
  //        linVelocity=alphaLin*linVelocity + (1-alphaLin) * constrainedLinVel;
  //        ///
  //
  //        Vector3 constrainedAngVel=angularVel;
  //        if (getContactsNumber()==2)
  //        {
  //
  //            Vector3 interlegAxis = contactPos[1]-contactPos[0];
  //            constrainedAngVel -= (angularVel.dot(interlegAxis) * interlegAxis)/interlegAxis.squaredNorm();
  //        }
  //        else if (getContactsNumber()>2)
  //        {
  //            constrainedAngVel.setZero();
  //        }
  //        double alphaAng = 0.1;
  //        angularVel = alphaAng*angularVel + (1-alphaAng)*constrainedAngVel;

  op_.orientationAA = op_.rFlex;
  oriVector.noalias() = op_.orientationAA.angle() * op_.orientationAA.axis();

  computeForcesAndMoments(contactPos, contactOri, op_.contactVelArray, op_.contactAngVelArray, position, linVelocity,
                          oriVector, op_.rFlex, angularVel, fc, tc);
}